

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaRex.c
# Opt level: O0

void Gia_ManAutomWalk(Gia_Man_t *p,int nSteps,int nWalks,int fVerbose)

{
  int iVar1;
  uint uVar2;
  word wVar3;
  ulong local_50;
  word State;
  word Init;
  Vec_Int_t *pVStack_38;
  int i;
  Vec_Int_t *vCounts;
  Vec_Wrd_t *vStates;
  Vec_Wrd_t *vTemp;
  int local_18;
  int fVerbose_local;
  int nWalks_local;
  int nSteps_local;
  Gia_Man_t *p_local;
  
  vTemp._4_4_ = fVerbose;
  local_18 = nWalks;
  fVerbose_local = nSteps;
  _nWalks_local = p;
  iVar1 = Gia_ManPoNum(p);
  if (iVar1 == 1) {
    iVar1 = Gia_ManPiNum(_nWalks_local);
    if (iVar1 < 0x41) {
      iVar1 = Gia_ManRegNum(_nWalks_local);
      if (iVar1 < 0x41) {
        iVar1 = Gia_ManObjNum(_nWalks_local);
        vStates = Vec_WrdStart(iVar1);
        vCounts = (Vec_Int_t *)Vec_WrdAlloc(1000);
        pVStack_38 = Vec_IntAlloc(1000);
        Vec_WrdPush((Vec_Wrd_t *)vCounts,0);
        Vec_IntPush(pVStack_38,1);
        State = Gia_ManAutomInit(_nWalks_local);
        for (Init._4_4_ = 0; (int)Init._4_4_ < local_18; Init._4_4_ = Init._4_4_ + 1) {
          Gia_ManAutomWalkOne(_nWalks_local,fVerbose_local,(Vec_Wrd_t *)vCounts,pVStack_38,vStates,
                              State);
        }
        if (vTemp._4_4_ != 0) {
          for (Init._4_4_ = 0; uVar2 = Init._4_4_, iVar1 = Vec_WrdSize((Vec_Wrd_t *)vCounts),
              (int)uVar2 < iVar1; Init._4_4_ = Init._4_4_ + 1) {
            wVar3 = Vec_WrdEntry((Vec_Wrd_t *)vCounts,Init._4_4_);
            local_50 = State ^ wVar3;
            printf("%3d : ",(ulong)Init._4_4_);
            Extra_PrintBinary(_stdout,(uint *)&local_50,0x40);
            uVar2 = Vec_IntEntry(pVStack_38,Init._4_4_);
            printf(" %d  ",(ulong)uVar2);
            printf("\n");
          }
          printf("\n");
        }
        Vec_WrdFree(vStates);
        Vec_WrdFree((Vec_Wrd_t *)vCounts);
        Vec_IntFree(pVStack_38);
      }
      else {
        printf("Cannot simulate an automaton with more than 63 states.\n");
      }
    }
    else {
      printf("Cannot simulate an automaton with more than 64 inputs.\n");
    }
  }
  else {
    printf("AIG should have one primary output.\n");
  }
  return;
}

Assistant:

void Gia_ManAutomWalk( Gia_Man_t * p, int nSteps, int nWalks, int fVerbose )
{
    Vec_Wrd_t * vTemp, * vStates;
    Vec_Int_t * vCounts; int i; word Init;
    if ( Gia_ManPoNum(p) != 1 )
    {
        printf( "AIG should have one primary output.\n" );
        return;
    }
    if ( Gia_ManPiNum(p) > 64 )
    {
        printf( "Cannot simulate an automaton with more than 64 inputs.\n" );
        return;
    }
    if ( Gia_ManRegNum(p) > 64 )
    {
        printf( "Cannot simulate an automaton with more than 63 states.\n" );
        return;
    }
    vTemp   = Vec_WrdStart( Gia_ManObjNum(p) );
    vStates = Vec_WrdAlloc( 1000 );
    vCounts = Vec_IntAlloc( 1000 );
    Vec_WrdPush( vStates, 0 );
    Vec_IntPush( vCounts, 1 );
    Init = Gia_ManAutomInit( p );
    for ( i = 0; i < nWalks; i++ )
        Gia_ManAutomWalkOne( p, nSteps, vStates, vCounts, vTemp, Init );
    if ( fVerbose )
    {
        word State;
        Vec_WrdForEachEntry( vStates, State, i )
        {
            State ^= Init;
            printf( "%3d : ", i );
            Extra_PrintBinary( stdout, (unsigned *)&State, 64 ); 
            printf( " %d  ", Vec_IntEntry(vCounts, i) );
            printf( "\n" );
        }
        printf( "\n" );
    }
    Vec_WrdFree( vTemp );
    Vec_WrdFree( vStates );
    Vec_IntFree( vCounts );
}